

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O0

void __thiscall LASindex::print(LASindex *this)

{
  LASinterval *pLVar1;
  BOOL BVar2;
  uint local_28;
  uint local_24;
  U32 intervals;
  U32 total_check;
  U32 total_intervals;
  U32 total_total;
  U32 total_full;
  U32 total_cells;
  LASindex *this_local;
  
  total_total = 0;
  total_intervals = 0;
  total_check = 0;
  intervals = 0;
  LASinterval::get_cells(this->interval);
  while( true ) {
    BVar2 = LASinterval::has_cells(this->interval);
    if (!BVar2) break;
    local_24 = 0;
    local_28 = 0;
    while( true ) {
      BVar2 = LASinterval::has_intervals(this->interval);
      if (!BVar2) break;
      local_24 = (this->interval->end - this->interval->start) + 1 + local_24;
      local_28 = local_28 + 1;
    }
    if (local_24 != this->interval->total) {
      LASMessage(LAS_VERBOSE,"total_check %d != interval->total %d",(ulong)local_24,
                 (ulong)this->interval->total);
    }
    pLVar1 = this->interval;
    LASMessage(LAS_VERY_VERBOSE,"cell %d intervals %d full %d total %d (%.2f)",
               (double)(((float)pLVar1->full * 100.0) / (float)pLVar1->total),
               (ulong)(uint)pLVar1->index,(ulong)local_28,(ulong)pLVar1->full,(ulong)pLVar1->total);
    total_total = total_total + 1;
    total_intervals = this->interval->full + total_intervals;
    total_check = this->interval->total + total_check;
    intervals = local_28 + intervals;
  }
  LASMessage(LAS_VERY_VERBOSE,"total cells/intervals %d/%d full %d (%.2f)",
             (double)(((float)total_intervals * 100.0) / (float)total_check),(ulong)total_total,
             (ulong)intervals,(ulong)total_intervals);
  return;
}

Assistant:

void LASindex::print()
{
  U32 total_cells = 0;
  U32 total_full = 0;
  U32 total_total = 0;
  U32 total_intervals = 0;
  U32 total_check;
  U32 intervals;
  interval->get_cells();
  while (interval->has_cells())
  {
    total_check = 0;
    intervals = 0;
    while (interval->has_intervals())
    {
      total_check += interval->end-interval->start+1;
      intervals++;
    }
    if (total_check != interval->total)
    {
      LASMessage(LAS_VERBOSE, "total_check %d != interval->total %d", total_check, interval->total);
    }
    LASMessage(LAS_VERY_VERBOSE, "cell %d intervals %d full %d total %d (%.2f)", interval->index, intervals, interval->full, interval->total, 100.0f*interval->full/interval->total);
    total_cells++;
    total_full += interval->full;
    total_total += interval->total;
    total_intervals += intervals;
  }
  LASMessage(LAS_VERY_VERBOSE, "total cells/intervals %d/%d full %d (%.2f)", total_cells, total_intervals, total_full, 100.0f*total_full/total_total);
}